

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void tests::nested_to_dot(void)

{
  pointer ppNVar1;
  NS *pNVar2;
  NS *local_40;
  NS *local_38;
  NS *local_28;
  
  test_graphs::simple();
  test_graphs::two_nested();
  test_graphs::double_nested();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"digraph g {",0xb);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
  std::ostream::put('\x18');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"compound=true;",0xe);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
  std::ostream::put('\x18');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"overlap = false;\nsplines = true;",0x20);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
  std::ostream::put('\x18');
  std::ostream::flush();
  draw_nested(local_28);
  draw_nested(local_38);
  draw_nested(local_40);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"}",1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
  std::ostream::put('\x18');
  std::ostream::flush();
  pNVar2 = NS::clear(local_28);
  if ((pNVar2 != (NS *)0x0) &&
     (ppNVar1 = (pNVar2->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.
                super__Vector_impl_data._M_start, ppNVar1 != (pointer)0x0)) {
    operator_delete(ppNVar1,(long)(pNVar2->_os).super__Vector_base<N_*,_std::allocator<N_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppNVar1)
    ;
  }
  operator_delete(pNVar2,0x18);
  NS::clear(local_38);
  NS::clear(local_40);
  return;
}

Assistant:

void nested_to_dot() {
        auto [f, _] = test_graphs::simple();
        auto [g] = test_graphs::two_nested();
        auto [h] = test_graphs::double_nested();

        cout << "digraph g {" << endl;
        cout << "compound=true;" << endl;
        cout << "overlap = false;\nsplines = true;" << endl;
        draw_nested(f);
        draw_nested(g);
        draw_nested(h);
        cout << "}" << endl;

        delete f->clear(), g->clear(), h->clear();
    }